

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O0

void __thiscall StressTester::Run(StressTester *this)

{
  int iVar1;
  TestObject *pTVar2;
  int local_610;
  int i;
  TestObject *root;
  anon_class_8_1_a8a4b1a8 ObjectVisitor;
  TestObject *stack;
  void *addr;
  char memory [1456];
  size_t sizeRequired;
  int stackPointers;
  int stackExtraBytes;
  StressTester *this_local;
  
  pTVar2 = (TestObject *)AlignPtr<char*>((char *)&addr,0x20);
  TestObject::TestObject(pTVar2,1000,0x32);
  ObjectVisitor.stack = (TestObject **)pTVar2;
  do {
    do {
      pTVar2 = CreateLinkedList(this);
      TestObject::Visit(this->recycler,pTVar2);
      pTVar2 = CreateTree(this);
      TestObject::Visit<StressTester::Run()::__0>
                (this->recycler,pTVar2,(anon_class_8_1_a8a4b1a8)&ObjectVisitor);
      TestObject::Visit(this->recycler,pTVar2);
      pTVar2 = CreateRandom(this);
      TestObject::Visit<StressTester::Run()::__0>
                (this->recycler,pTVar2,(anon_class_8_1_a8a4b1a8)&ObjectVisitor);
      TestObject::Visit(this->recycler,pTVar2);
      TestObject::Visit<StressTester::Run()::__1>(this->recycler,ObjectVisitor.stack);
      iVar1 = PAL_rand();
    } while (iVar1 % 3 != 0);
    for (local_610 = 0; local_610 < *(int *)(ObjectVisitor.stack + 1); local_610 = local_610 + 1) {
      TestObject::Set((TestObject *)ObjectVisitor.stack,local_610,(TestObject *)0x0);
    }
  } while( true );
}

Assistant:

void StressTester::Run()
{

    const int stackExtraBytes = 1000;
    const int stackPointers = 50;
    const size_t sizeRequired = sizeof(TestObject)+stackExtraBytes + stackPointers * sizeof(TestObject*) + OBJALIGN;
    char memory[sizeRequired];
    void *addr = AlignPtr(memory, OBJALIGN);

    TestObject *stack = new (addr) TestObject(stackExtraBytes, stackPointers);

    auto ObjectVisitor = [&](TestObject *object) {
        // Clear out one of the pointers.
        if (rand() % 5 == 0)
        {
            object->ClearOne();
        }

        // Maybe store a pointer on the stack.
        if (rand() % 25 == 0)
        {
            stack->SetRandom(object);
        }

        // Maybe add a stack reference to the current object
        if (rand() % 25 == 0)
        {
            object->SetRandom(stack->Get(rand() % stack->pointerCount));
        }

    };

    while (1)
    {
        TestObject *root = CreateLinkedList();
        TestObject::Visit(recycler, root);

        root = CreateTree();
        TestObject::Visit(recycler, root, ObjectVisitor);
        TestObject::Visit(recycler, root);

        root = CreateRandom();
        TestObject::Visit(recycler, root, ObjectVisitor);
        TestObject::Visit(recycler, root);

        TestObject::Visit(recycler, stack, [&](TestObject *object) {
            if (rand() % 10 == 0)
            {
                object->ClearOne();
            }
        });

        if (rand() % 3 == 0)
        {
            for (int i = 0; i < stack->pointerCount; ++i)
            {
                stack->Set(i, nullptr);
            }
        }
    }
}